

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O1

int PSolve(sunrealtype tn,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  char cVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  char cVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  sunrealtype gam2 [6];
  sunrealtype gam [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  sunrealtype cof1 [6];
  ulong local_1b0;
  double adStack_128 [6];
  double adStack_f8 [6];
  double adStack_c8 [6];
  double adStack_98 [6];
  double adStack_68 [7];
  
  N_VScale(0x3ff0000000000000,r);
  uVar7 = *(undefined8 *)((long)user_data + 0x978);
  lVar10 = N_VGetArrayPointer();
  lVar11 = N_VGetArrayPointer(z);
  uVar17 = *(uint *)((long)user_data + 0x40);
  lVar14 = (long)(int)uVar17;
  uVar25 = (ulong)uVar17;
  uVar2 = *(uint *)((long)user_data + 0x50);
  uVar3 = *(uint *)((long)user_data + 0x54);
  uVar26 = (ulong)uVar3;
  if (0 < lVar14) {
    lVar15 = 0;
    do {
      dVar27 = *(double *)((long)user_data + lVar15 + 0x240);
      dVar1 = *(double *)((long)user_data + lVar15 + 0x270);
      dVar28 = 1.0 / ((dVar27 + dVar1) * (gamma + gamma) + 1.0);
      dVar27 = dVar27 * gamma * dVar28;
      *(double *)((long)adStack_98 + lVar15) = dVar27;
      *(double *)((long)adStack_c8 + lVar15) = dVar27 + dVar27;
      dVar27 = dVar1 * gamma * dVar28;
      *(double *)((long)adStack_f8 + lVar15) = dVar27;
      *(double *)((long)adStack_128 + lVar15) = dVar27 + dVar27;
      *(double *)((long)adStack_68 + lVar15) = dVar28;
      lVar15 = lVar15 + 8;
    } while (uVar25 * 8 - lVar15 != 0);
  }
  lVar15 = (long)*(int *)((long)user_data + 0x44);
  if (0 < (int)uVar3) {
    uVar16 = 0;
    lVar19 = lVar10;
    do {
      if (0 < (int)uVar2) {
        uVar23 = 0;
        lVar21 = lVar11;
        lVar22 = lVar19;
        do {
          if (0 < (int)uVar17) {
            uVar24 = 0;
            do {
              *(double *)(lVar22 + uVar24 * 8) =
                   adStack_68[uVar24] * *(double *)(lVar21 + uVar24 * 8);
              uVar24 = uVar24 + 1;
            } while (uVar25 != uVar24);
          }
          uVar23 = uVar23 + 1;
          lVar22 = lVar22 + lVar14 * 8;
          lVar21 = lVar21 + lVar14 * 8;
        } while (uVar23 != uVar2);
      }
      uVar16 = uVar16 + 1;
      lVar19 = lVar19 + lVar15 * 8;
      lVar11 = lVar11 + lVar15 * 8;
    } while (uVar16 != uVar26);
  }
  N_VConst(0);
  lVar19 = lVar14 * -8;
  lVar11 = lVar15 * -8;
  uVar12 = 1;
  do {
    if (1 < uVar12 && 0 < (int)uVar3) {
      local_1b0 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar17 = (uint)(local_1b0 == uVar3 - 1) * 3 + 3;
          if (local_1b0 == 0) {
            uVar17 = 0;
          }
          iVar9 = (*(code *)((long)&DAT_00105100 + (long)(int)(&DAT_00105100)[uVar17]))();
          return iVar9;
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != uVar26);
    }
    if (0 < (int)uVar3) {
      uVar16 = 0;
      lVar21 = lVar10;
      do {
        if (0 < (int)uVar2) {
          cVar13 = (uVar16 == uVar3 - 1) * '\x03' + '\x03';
          if (uVar16 == 0) {
            cVar13 = '\0';
          }
          uVar23 = 0;
          lVar22 = lVar21;
          do {
            cVar20 = (uVar23 == uVar2 - 1) + '\x01';
            if (uVar23 == 0) {
              cVar20 = '\0';
            }
            switch(cVar20 + cVar13) {
            case '\x01':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_98[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\x02':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_c8[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\x03':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_f8[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\x04':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_98[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_f8[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\x05':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_c8[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_f8[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\x06':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_128[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\a':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_98[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_128[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              break;
            case '\b':
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_c8[uVar24] * *(double *)(lVar22 + lVar19 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  *(double *)(lVar22 + uVar24 * 8) =
                       adStack_128[uVar24] * *(double *)(lVar11 + lVar22 + uVar24 * 8) +
                       *(double *)(lVar22 + uVar24 * 8);
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
            }
            uVar23 = uVar23 + 1;
            lVar22 = lVar22 + lVar14 * 8;
          } while (uVar23 != uVar2);
        }
        uVar16 = uVar16 + 1;
        lVar21 = lVar21 + lVar15 * 8;
      } while (uVar16 != uVar26);
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,z,uVar7,z);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 6);
  iVar9 = *(int *)((long)user_data + 0x54);
  if (0 < (long)iVar9) {
    uVar17 = *(uint *)((long)user_data + 0x50);
    iVar4 = *(int *)((long)user_data + 0x5c);
    iVar5 = *(int *)((long)user_data + 0x48);
    lVar10 = 0;
    iVar18 = 0;
    do {
      if (0 < (int)uVar17) {
        iVar6 = *(int *)((long)user_data + lVar10 * 4 + 0x98);
        lVar11 = (long)iVar18 * 8;
        iVar18 = iVar18 + iVar5 * uVar17;
        uVar26 = 0;
        do {
          lVar14 = (long)*(int *)((long)user_data + uVar26 * 4 + 0x80) + (long)iVar6 * (long)iVar4;
          uVar7 = *(undefined8 *)((long)user_data + lVar14 * 8);
          uVar8 = *(undefined8 *)((long)user_data + lVar14 * 8 + 0x20);
          lVar14 = N_VGetArrayPointer(z);
          SUNDlsMat_denseGETRS(uVar7,(long)iVar5,uVar8,lVar14 + lVar11);
          uVar26 = uVar26 + 1;
          lVar11 = lVar11 + (long)iVar5 * 8;
        } while (uVar17 != uVar26);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar9);
  }
  return 0;
}

Assistant:

static int PSolve(sunrealtype tn, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->tmp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  return (0);
}